

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O0

complex<double> * c8vec_uniform_01_new(int n,int *seed)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  double __r;
  double __i;
  undefined8 extraout_XMM0_Qa;
  complex<double> *local_98;
  complex<double> local_78;
  double local_60;
  double local_48;
  double theta;
  double r8_pi;
  double dStack_30;
  int k;
  double r;
  complex<double> *pcStack_20;
  int i;
  complex<double> *c;
  int *seed_local;
  int n_local;
  
  theta = 3.141592653589793;
  uVar2 = (ulong)n;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  c = (complex<double> *)seed;
  seed_local._4_4_ = n;
  pcStack_20 = (complex<double> *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_98 = pcStack_20;
    do {
      std::complex<double>::complex(local_98,0.0,0.0);
      local_98 = local_98 + 1;
    } while (local_98 != pcStack_20 + uVar2);
  }
  for (r._4_4_ = 0; r._4_4_ < seed_local._4_4_; r._4_4_ = r._4_4_ + 1) {
    r8_pi._4_4_ = *(int *)c->_M_value / 0x1f31d;
    *(int *)c->_M_value = *(int *)c->_M_value * 0x41a7 + r8_pi._4_4_ * -0x7fffffff;
    if (*(int *)c->_M_value < 0) {
      *(int *)c->_M_value = *(int *)c->_M_value + 0x7fffffff;
    }
    dStack_30 = sqrt((double)*(int *)c->_M_value * 4.656612875e-10);
    r8_pi._4_4_ = *(int *)c->_M_value / 0x1f31d;
    *(int *)c->_M_value = *(int *)c->_M_value * 0x41a7 + r8_pi._4_4_ * -0x7fffffff;
    if (*(int *)c->_M_value < 0) {
      *(int *)c->_M_value = *(int *)c->_M_value + 0x7fffffff;
    }
    local_48 = (double)*(int *)c->_M_value * 4.656612875e-10 * 6.283185307179586;
    __r = cos(local_48);
    __i = sin(local_48);
    std::complex<double>::complex(&local_78,__r,__i);
    std::operator*(&stack0xffffffffffffffd0,&local_78);
    *(undefined8 *)pcStack_20[r._4_4_]._M_value = extraout_XMM0_Qa;
    *(double *)((long)pcStack_20[r._4_4_]._M_value + 8) = __i;
    local_60 = __i;
  }
  return pcStack_20;
}

Assistant:

complex <double> *c8vec_uniform_01_new ( int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    C8VEC_UNIFORM_01_NEW returns a unit pseudorandom C8VEC.
//
//  Discussion:
//
//    A C8VEC is a vector of complex <double> values.
//
//    The angles should be uniformly distributed between 0 and 2 * PI,
//    the square roots of the radius uniformly distributed between 0 and 1.
//
//    This results in a uniform distribution of values in the unit circle.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    15 March 2005
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of values to compute.
//
//    Input/output, int &SEED, the "seed" value, which should NOT be 0.
//    On output, SEED has been updated.
//
//    Output, complex <double> C8VEC_UNIFORM_01_NEW[N], the pseudorandom 
//    complex vector.
//
{
  complex <double> *c;
  int i;
  double r;
  int k;
  const double r8_pi = 3.141592653589793;
  double theta;

  c = new complex <double> [n];

  for ( i = 0; i < n; i++ )
  {
    k = seed / 127773;

    seed = 16807 * ( seed - k * 127773 ) - k * 2836;

    if ( seed < 0 )
    {
      seed = seed + 2147483647;
    }

    r = sqrt ( static_cast<double>(seed) * 4.656612875E-10 );

    k = seed / 127773;

    seed = 16807 * ( seed - k * 127773 ) - k * 2836;

    if ( seed < 0 )
    {
      seed = seed + 2147483647;
    }

    theta = 2.0 * r8_pi * ( static_cast<double>(seed) * 4.656612875E-10 );

    c[i] = r * complex <double> ( cos ( theta ), sin ( theta ) );
  }

  return c;
}